

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O2

char * extract_encoder_settings(char *version,char **argv,int argc,char *input_fname)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s;
  int iVar4;
  char *__s_00;
  
  sVar2 = strlen(version);
  sVar2 = sVar2 + 9;
  iVar4 = 1;
  while (iVar4 < argc) {
    iVar1 = anon_unknown.dwarf_176c0::skip_input_output_arg(argv[iVar4],input_fname);
    iVar4 = iVar4 + iVar1;
    if (iVar1 == 0) {
      sVar3 = strlen(argv[iVar4]);
      sVar2 = sVar2 + sVar3 + 1;
      iVar4 = iVar4 + 1;
    }
  }
  __s = (char *)malloc(sVar2);
  if (__s != (char *)0x0) {
    iVar4 = snprintf(__s,sVar2,"version:%s",version);
    __s_00 = __s + iVar4;
    iVar4 = 1;
    while (iVar4 < argc) {
      iVar1 = anon_unknown.dwarf_176c0::skip_input_output_arg(argv[iVar4],input_fname);
      iVar4 = iVar4 + iVar1;
      if (iVar1 == 0) {
        iVar1 = snprintf(__s_00,sVar2," %s",argv[iVar4]);
        __s_00 = __s_00 + iVar1;
        iVar4 = iVar4 + 1;
      }
    }
    *__s_00 = '\0';
  }
  return __s;
}

Assistant:

char *extract_encoder_settings(const char *version, const char **argv, int argc,
                               const char *input_fname) {
  // + 9 for "version:" prefix and for null terminator.
  size_t total_size = strlen(version) + 9;
  int i = 1;
  while (i < argc) {
    int num_skip = skip_input_output_arg(argv[i], input_fname);
    i += num_skip;
    if (num_skip == 0) {
      total_size += strlen(argv[i]) + 1;  // + 1 is for space separator.
      ++i;
    }
  }
  char *result = static_cast<char *>(malloc(total_size));
  if (result == nullptr) {
    return nullptr;
  }
  char *cur = result;
  cur += snprintf(cur, total_size, "version:%s", version);
  i = 1;
  while (i < argc) {
    int num_skip = skip_input_output_arg(argv[i], input_fname);
    i += num_skip;
    if (num_skip == 0) {
      cur += snprintf(cur, total_size, " %s", argv[i]);
      ++i;
    }
  }
  *cur = '\0';
  return result;
}